

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleDifferentCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *value;
  uint uVar5;
  pointer pbVar6;
  pointer __s;
  ulong uVar7;
  int iVar8;
  ostringstream e;
  pointer local_1d8;
  pointer local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x21) {
    __s = (char *)0x0;
    local_1d0 = (char *)0x0;
    local_1d8 = (char *)0x0;
  }
  else {
    iVar8 = 1;
    uVar7 = 1;
    uVar5 = 2;
    local_1d8 = (pointer)0x0;
    local_1d0 = (pointer)0x0;
    __s = (pointer)0x0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + uVar7));
      if (iVar3 == 0) {
        iVar8 = 2;
      }
      else {
        if (iVar8 == 3) {
          local_1d0 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
        }
        else {
          if (iVar8 == 2) {
            __s = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
            iVar8 = 3;
            goto LAB_0024bcd4;
          }
          if (iVar8 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"DIFFERENT given unknown argument ",0x21);
            pbVar6 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pbVar6[uVar7]._M_dataplus._M_p,
                       pbVar6[uVar7]._M_string_length);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            return false;
          }
          local_1d8 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
        }
        iVar8 = 0;
      }
LAB_0024bcd4:
      uVar7 = (ulong)uVar5;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (uVar7 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
  }
  if (local_1d8 == (char *)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DIFFERENT not given result variable name.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    if ((__s != (char *)0x0) && (local_1d0 != (char *)0x0)) {
      pcVar1 = local_1a8 + 0x10;
      local_1a8._0_8_ = pcVar1;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar4);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar4 = strlen(local_1d0);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,local_1d0,local_1d0 + sVar4);
      bVar2 = cmsys::SystemTools::FilesDiffer((string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      this_00 = (this->super_cmCommand).Makefile;
      local_1a8._0_8_ = pcVar1;
      sVar4 = strlen(local_1d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d8,local_1d8 + sVar4);
      value = "0";
      if (bVar2) {
        value = "1";
      }
      cmMakefile::AddDefinition(this_00,(string *)local_1a8,value);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      return true;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DIFFERENT not given FILES option with two file names.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmFileCommand::HandleDifferentCommand(
  std::vector<std::string> const& args)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "DIFFERENT given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (!var) {
    this->SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    this->SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  this->Makefile->AddDefinition(var, result);
  return true;
}